

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 in_RSI;
  undefined4 in_EDI;
  KonohaContext *konoha;
  KonohaFactory factory;
  undefined1 local_3e0 [24];
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined4 local_3c0;
  char **in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc64;
  KonohaContext *in_stack_fffffffffffffc68;
  
  memset(local_3e0,0,0x3d0);
  pcVar2 = getenv("KONOHA_DEBUG");
  if (pcVar2 != (char *)0x0) {
    local_3c8 = 1;
    local_3c4 = 1;
    local_3c0 = 1;
  }
  KonohaFactory_SetDefaultFactory(local_3e0,PosixFactory,in_EDI,in_RSI);
  uVar3 = KonohaFactory_CreateKonoha(local_3e0);
  Konoha_ParseCommandOption
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,in_stack_fffffffffffffc58);
  iVar1 = Konoha_Destroy(uVar3);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	struct KonohaFactory factory = {};
	if(getenv("KONOHA_DEBUG") != NULL) {
		factory.verbose_debug = 1;
		factory.verbose_sugar = 1;
		factory.verbose_code = 1;
	}
	KonohaFactory_SetDefaultFactory(&factory, PosixFactory, argc, argv);
	KonohaContext* konoha = KonohaFactory_CreateKonoha(&factory);
	Konoha_ParseCommandOption(konoha, argc, argv);
	return Konoha_Destroy(konoha);
}